

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O0

void __thiscall cp::PlanFootprints::calcNextFootprint(PlanFootprints *this)

{
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *this_00;
  RotationBase<Eigen::Quaternion<double,0>,3> *this_01;
  QuaternionBase<Eigen::Quaternion<double,0>> *this_02;
  QuaternionBase<Eigen::Quaternion<double,_0>_> *other;
  Quat *other_00;
  undefined1 local_78 [8];
  Quat ref_land_pose_q;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_40;
  undefined1 local_28 [8];
  Vector3 ref_land_pose_p;
  PlanFootprints *this_local;
  
  ref_land_pose_p.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = (double)this;
  this_00 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)Pose::p((Pose *)(this + 0x1d0));
  this_01 = (RotationBase<Eigen::Quaternion<double,0>,3> *)Pose::q((Pose *)(this + 0x1d0));
  Eigen::RotationBase<Eigen::Quaternion<double,0>,3>::operator*
            ((ReturnType *)
             (ref_land_pose_q.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 3),this_01,
             (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (this + (ulong)*(uint *)(this + 0x2e0) * 0x18 + 0x4d8));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (&local_40,this_00,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (ref_land_pose_q.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array + 3));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,3,1,0,3,1> *)local_28,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_40);
  this_02 = (QuaternionBase<Eigen::Quaternion<double,0>> *)Pose::q((Pose *)(this + 0x1d0));
  other = (QuaternionBase<Eigen::Quaternion<double,_0>_> *)Pose::q((Pose *)(this + 0x310));
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            ((Quaternion<double,_0> *)local_78,this_02,other);
  Pose::set((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x10),(Vector3 *)local_28,
            (Quat *)local_78);
  other_00 = Pose::q((Pose *)(this + 0x1d0));
  Eigen::Quaternion<double,_0>::operator=((Quaternion<double,_0> *)(this + 0x2b0),other_00);
  return;
}

Assistant:

void PlanFootprints::calcNextFootprint() {
  Vector3 ref_land_pose_p = ref_waist_pose.p() +
                            ref_waist_pose.q() * dist_body2foot[swingleg];
  Quat ref_land_pose_q    = ref_waist_pose.q() * init_feet_pose[0].q();
  ref_land_pose[swingleg].set(ref_land_pose_p, ref_land_pose_q);
  ref_waist_r = ref_waist_pose.q();
}